

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recompose.hpp
# Opt level: O3

int __thiscall MGARD::Recomposer<float>::init(Recomposer<float> *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __result;
  ulong *puVar4;
  float *pfVar5;
  ulong *puVar6;
  ulong uVar7;
  size_t __size;
  bool bVar8;
  
  puVar4 = *(ulong **)ctx;
  puVar2 = *(ulong **)(ctx + 8);
  puVar6 = puVar4 + 1;
  if (puVar6 != puVar2 && puVar4 != puVar2) {
    uVar7 = *puVar4;
    do {
      uVar3 = *puVar6;
      bVar8 = uVar7 < uVar3;
      if (uVar7 <= uVar3) {
        uVar7 = uVar3;
      }
      if (bVar8) {
        puVar4 = puVar6;
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar2);
  }
  uVar1 = this->default_batch_size;
  uVar7 = *puVar4;
  if (this->data_buffer != (float *)0x0) {
    free(this->data_buffer);
  }
  if (this->correction_buffer != (float *)0x0) {
    free(this->correction_buffer);
  }
  if (this->load_v_buffer != (float *)0x0) {
    free(this->load_v_buffer);
  }
  __size = uVar1 * uVar7 * 4;
  pfVar5 = (float *)malloc(this->data_buffer_size);
  this->data_buffer = pfVar5;
  pfVar5 = (float *)malloc(__size);
  this->correction_buffer = pfVar5;
  pfVar5 = (float *)malloc(__size);
  this->load_v_buffer = pfVar5;
  return (int)pfVar5;
}

Assistant:

void init(const vector<size_t>& dims){
		size_t buffer_size = default_batch_size * (*max_element(dims.begin(), dims.end())) * sizeof(T);
		// cerr << "buffer_size = " << buffer_size << endl;
		// cerr << "data_buffer_size = " << data_buffer_size << endl;
		if(data_buffer) free(data_buffer);
		if(correction_buffer) free(correction_buffer);
		if(load_v_buffer) free(load_v_buffer);
		data_buffer = (T *) malloc(data_buffer_size);
		correction_buffer = (T *) malloc(buffer_size);
		load_v_buffer = (T *)malloc(buffer_size);
	}